

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::exprAndTest(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  InfixExprNode *this_00;
  ExprNode **ppEVar3;
  ExprNode *pEVar4;
  Token local_188;
  undefined1 local_111;
  Token local_110;
  InfixExprNode *local_a0;
  InfixExprNode *p;
  undefined1 local_88 [8];
  Token andOp;
  ExprNode *notTest;
  Parser *this_local;
  
  andOp._string.field_2._8_8_ = exprNotTest(this);
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  while( true ) {
    bVar2 = Token::isAnd((Token *)local_88);
    if (!bVar2) break;
    this_00 = (InfixExprNode *)operator_new(0x90);
    local_111 = 1;
    Token::Token(&local_110,(Token *)local_88);
    InfixExprNode::InfixExprNode(this_00,&local_110);
    local_111 = 0;
    Token::~Token(&local_110);
    uVar1 = andOp._string.field_2._8_8_;
    local_a0 = this_00;
    ppEVar3 = InfixExprNode::left(this_00);
    *ppEVar3 = (ExprNode *)uVar1;
    pEVar4 = exprNotTest(this);
    ppEVar3 = InfixExprNode::right(local_a0);
    *ppEVar3 = pEVar4;
    andOp._string.field_2._8_8_ = local_a0;
    Tokenizer::getToken(&local_188,this->tokenizer);
    Token::operator=((Token *)local_88,&local_188);
    Token::~Token(&local_188);
  }
  Tokenizer::ungetToken(this->tokenizer);
  uVar1 = andOp._string.field_2._8_8_;
  Token::~Token((Token *)local_88);
  return (ExprNode *)uVar1;
}

Assistant:

ExprNode *Parser::exprAndTest(){
    ExprNode *notTest = exprNotTest();
    Token andOp = tokenizer.getToken();
    while (andOp.isAnd()){
        auto *p = new InfixExprNode(andOp);
        p->left() = notTest;
        p->right() = exprNotTest();
        notTest = p;
        andOp = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return notTest;

}